

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_wif_trace.cpp
# Opt level: O2

void __thiscall
sc_core::wif_sc_signed_trace::wif_sc_signed_trace
          (wif_sc_signed_trace *this,sc_signed *object_,string *name_,string *wif_name_)

{
  wif_trace::wif_trace(&this->super_wif_trace,name_,wif_name_);
  (this->super_wif_trace)._vptr_wif_trace = (_func_int **)&PTR_write_00265510;
  this->object = object_;
  sc_dt::sc_signed::sc_signed(&this->old_value,object_->nbits);
  sc_dt::sc_signed::operator=(&this->old_value,this->object);
  (this->super_wif_trace).wif_type = "BIT";
  return;
}

Assistant:

wif_sc_signed_trace::wif_sc_signed_trace(const sc_dt::sc_signed& object_,
					 const std::string& name_,
					 const std::string& wif_name_)
: wif_trace(name_, wif_name_), object(object_), old_value(object_.length())
{
    old_value = object;
    wif_type = "BIT";
}